

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md32_common.h
# Opt level: O0

void crypto_md32_update(crypto_md32_block_func block_func,uint32_t *h,uint8_t *data,
                       size_t block_size,uint *num,uint32_t *Nh,uint32_t *Nl,uint8_t *in,size_t len)

{
  uint uVar1;
  ulong uVar2;
  size_t n;
  uint32_t l;
  uint32_t *Nh_local;
  uint *num_local;
  size_t block_size_local;
  uint8_t *data_local;
  uint32_t *h_local;
  crypto_md32_block_func block_func_local;
  
  if (len != 0) {
    uVar1 = *Nl + (int)len * 8;
    if (uVar1 < *Nl) {
      *Nh = *Nh + 1;
    }
    *Nh = (int)(len >> 0x1d) + *Nh;
    *Nl = uVar1;
    uVar2 = (ulong)*num;
    if (uVar2 != 0) {
      if ((len < block_size) && (len + uVar2 < block_size)) {
        OPENSSL_memcpy(data + uVar2,in,len);
        *num = (int)len + *num;
        return;
      }
      OPENSSL_memcpy(data + uVar2,in,block_size - uVar2);
      (*block_func)(h,data,1);
      in = in + (block_size - uVar2);
      len = len - (block_size - uVar2);
      *num = 0;
      OPENSSL_memset(data,0,block_size);
    }
    uVar2 = len / block_size;
    if (uVar2 != 0) {
      (*block_func)(h,in,uVar2);
      in = in + block_size * uVar2;
      len = len - block_size * uVar2;
    }
    if (len != 0) {
      *num = (uint)len;
      OPENSSL_memcpy(data,in,len);
    }
  }
  return;
}

Assistant:

static inline void crypto_md32_update(crypto_md32_block_func block_func,
                                      uint32_t *h, uint8_t *data,
                                      size_t block_size, unsigned *num,
                                      uint32_t *Nh, uint32_t *Nl,
                                      const uint8_t *in, size_t len) {
  if (len == 0) {
    return;
  }

  uint32_t l = *Nl + (((uint32_t)len) << 3);
  if (l < *Nl) {
    // Handle carries.
    (*Nh)++;
  }
  *Nh += (uint32_t)(len >> 29);
  *Nl = l;

  size_t n = *num;
  if (n != 0) {
    if (len >= block_size || len + n >= block_size) {
      OPENSSL_memcpy(data + n, in, block_size - n);
      block_func(h, data, 1);
      n = block_size - n;
      in += n;
      len -= n;
      *num = 0;
      // Keep |data| zeroed when unused.
      OPENSSL_memset(data, 0, block_size);
    } else {
      OPENSSL_memcpy(data + n, in, len);
      *num += (unsigned)len;
      return;
    }
  }

  n = len / block_size;
  if (n > 0) {
    block_func(h, in, n);
    n *= block_size;
    in += n;
    len -= n;
  }

  if (len != 0) {
    *num = (unsigned)len;
    OPENSSL_memcpy(data, in, len);
  }
}